

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_suite.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  
  replace_null();
  replace_boolean();
  replace_integer();
  replace_real();
  replace_string();
  replace_wstring();
  replace_u16string();
  replace_u32string();
  replace_array();
  replace_array_repeated();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    // Cannot replace with container as new value because iterators will be
    // changed during replacement.

    replace_null();
    replace_boolean();
    replace_integer();
    replace_real();
    replace_string();
    replace_wstring();
    replace_u16string();
    replace_u32string();
    replace_array();
    replace_array_repeated();

    return boost::report_errors();
}